

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute_iterator * __thiscall
pugi::xml_attribute_iterator::operator--(xml_attribute_iterator *this)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  
  pxVar2 = (this->_wrap)._attr;
  if (pxVar2 == (xml_attribute_struct *)0x0) {
    pxVar1 = (this->_parent)._root;
    if ((pxVar1 == (xml_node_struct *)0x0) ||
       (pxVar2 = pxVar1->first_attribute, pxVar2 == (xml_attribute_struct *)0x0)) {
      pxVar2 = (xml_attribute_struct *)0x0;
    }
    else {
      pxVar2 = pxVar2->prev_attribute_c;
    }
  }
  else {
    pxVar2 = pxVar2->prev_attribute_c;
    if (pxVar2->next_attribute == (xml_attribute_struct *)0x0) {
      pxVar2 = (xml_attribute_struct *)0x0;
    }
  }
  (this->_wrap)._attr = pxVar2;
  return this;
}

Assistant:

PUGI__FN const xml_attribute_iterator& xml_attribute_iterator::operator--()
	{
		_wrap = _wrap._attr ? _wrap.previous_attribute() : _parent.last_attribute();
		return *this;
	}